

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# options_serializer_boost_po.h
# Opt level: O3

void __thiscall
VW::config::options_serializer_boost_po::serialize<int>
          (options_serializer_boost_po *this,
          typed_option<std::vector<int,_std::allocator<int>_>_> *typed_option)

{
  vector<int,_std::allocator<int>_> *__x;
  undefined1 *this_00;
  iterator __begin0;
  pointer piVar1;
  vector<int,_std::allocator<int>_> vec;
  vector<int,_std::allocator<int>_> local_48;
  
  __x = (typed_option->m_value).
        super___shared_ptr<std::vector<int,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2>.
        _M_ptr;
  if (__x != (vector<int,_std::allocator<int>_> *)0x0) {
    std::vector<int,_std::allocator<int>_>::vector(&local_48,__x);
    if (local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish !=
        local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start) {
      this_00 = &this->field_0x18;
      piVar1 = local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      do {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00," --",3);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)this_00,(typed_option->super_base_option).m_name._M_dataplus._M_p,
                   (typed_option->super_base_option).m_name._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00," ",1);
        std::ostream::operator<<(this_00,*piVar1);
        piVar1 = piVar1 + 1;
      } while (piVar1 != local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_finish);
    }
    if (local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start != (int *)0x0) {
      operator_delete(local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
  }
  return;
}

Assistant:

void serialize(typed_option<std::vector<T>>& typed_option)
  {
    auto vec = typed_option.value();
    if (vec.size() > 0)
    {
      for (auto const& value : vec)
      {
        m_output_stream << " --" << typed_option.m_name;
        m_output_stream << " " << value;
      }
    }
  }